

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

const_iterator __thiscall PcodeOpBank::end(PcodeOpBank *this,Address *addr)

{
  const_iterator cVar1;
  key_type local_18;
  
  local_18.pc.base = addr->base;
  local_18.pc.offset = addr->offset;
  local_18.uniq = 0xffffffff;
  cVar1 = std::
          _Rb_tree<SeqNum,_std::pair<const_SeqNum,_PcodeOp_*>,_std::_Select1st<std::pair<const_SeqNum,_PcodeOp_*>_>,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
          ::upper_bound((_Rb_tree<SeqNum,_std::pair<const_SeqNum,_PcodeOp_*>,_std::_Select1st<std::pair<const_SeqNum,_PcodeOp_*>_>,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>
                         *)this,&local_18);
  return (const_iterator)cVar1._M_node;
}

Assistant:

PcodeOpTree::const_iterator PcodeOpBank::end(const Address &addr) const

{
  return optree.upper_bound(SeqNum(addr,~((uintm)0)));
}